

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

QPDFTime * QUtil::get_current_qpdf_time(void)

{
  undefined1 auVar1 [16];
  QPDFTime *in_RDI;
  time_t now;
  tm ltime;
  time_t local_60;
  tm local_58;
  
  local_60 = time((time_t *)0x0);
  tzset();
  localtime_r(&local_60,&local_58);
  auVar1 = SEXT816(_timezone);
  in_RDI->year = local_58.tm_year + 0x76c;
  in_RDI->month = local_58.tm_mon + 1;
  in_RDI->day = local_58.tm_min;
  in_RDI->hour = local_58.tm_hour;
  in_RDI->minute = local_58.tm_min;
  in_RDI->second = local_58.tm_sec;
  in_RDI->tz_delta =
       (int)(SUB168(auVar1 * ZEXT816(0x8888888888888889),8) >> 5) -
       (SUB164(auVar1 * ZEXT816(0x8888888888888889),0xc) >> 0x1f);
  return in_RDI;
}

Assistant:

QUtil::QPDFTime
QUtil::get_current_qpdf_time()
{
#ifdef _WIN32
    SYSTEMTIME ltime;
    GetLocalTime(&ltime);
    TIME_ZONE_INFORMATION tzinfo;
    GetTimeZoneInformation(&tzinfo);
    return QPDFTime(
        static_cast<int>(ltime.wYear),
        static_cast<int>(ltime.wMonth),
        static_cast<int>(ltime.wDay),
        static_cast<int>(ltime.wHour),
        static_cast<int>(ltime.wMinute),
        static_cast<int>(ltime.wSecond),
        // tzinfo.Bias is minutes before UTC
        static_cast<int>(tzinfo.Bias));
#else
    struct tm ltime;
    time_t now = time(nullptr);
    tzset();
# ifdef HAVE_LOCALTIME_R
    localtime_r(&now, &ltime);
# else
    ltime = *localtime(&now);
# endif
# if HAVE_TM_GMTOFF
    // tm_gmtoff is seconds after UTC
    int tzoff = -static_cast<int>(ltime.tm_gmtoff / 60);
# elif HAVE_EXTERN_LONG_TIMEZONE
    // timezone is seconds before UTC, not adjusted for daylight saving time
    int tzoff = static_cast<int>(timezone / 60);
# else
    // Don't know how to get timezone on this platform
    int tzoff = 0;
# endif
    return {
        static_cast<int>(ltime.tm_year + 1900),
        static_cast<int>(ltime.tm_mon + 1),
        static_cast<int>(ltime.tm_mday),
        static_cast<int>(ltime.tm_hour),
        static_cast<int>(ltime.tm_min),
        static_cast<int>(ltime.tm_sec),
        tzoff};
#endif
}